

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
MatcherBase<const_phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
::~MatcherBase(MatcherBase<const_phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
               *this)

{
  MatcherBase<const_phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
  *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }